

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_5c59be::RNGState::SeedEvents(RNGState *this,CSHA512 *hasher)

{
  CSHA256 *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  uchar events_hash [32];
  unique_lock<std::mutex> local_48;
  uchar local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->m_events_mutex).super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  this_00 = &this->m_events_hasher;
  CSHA256::Finalize(this_00,local_38);
  CSHA512::Write(hasher,local_38,0x20);
  CSHA256::Reset(this_00);
  CSHA256::Write(this_00,local_38,0x20);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_events_mutex)
    {
        // We use only SHA256 for the events hashing to get the ASM speedups we have for SHA256,
        // since we want it to be fast as network peers may be able to trigger it repeatedly.
        LOCK(m_events_mutex);

        unsigned char events_hash[32];
        m_events_hasher.Finalize(events_hash);
        hasher.Write(events_hash, 32);

        // Re-initialize the hasher with the finalized state to use later.
        m_events_hasher.Reset();
        m_events_hasher.Write(events_hash, 32);
    }